

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subgetopt.c
# Opt level: O1

int subgetopt(int argc,char **argv,char *opts)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  char cVar7;
  char *pcVar8;
  
  subgetoptarg = (char *)0x0;
  if (((argv == (char **)0x0) || (argc <= subgetoptind)) || (argv[subgetoptind] == (char *)0x0)) {
    return subgetoptdone;
  }
  if (((long)subgetoptpos != 0) && (argv[subgetoptind][subgetoptpos] == '\0')) {
    subgetoptind = subgetoptind + 1;
    subgetoptpos = 0;
    if (argc <= subgetoptind) {
      subgetoptpos = 0;
      subgetoptarg = (char *)0x0;
      return subgetoptdone;
    }
    if (argv[subgetoptind] == (char *)0x0) {
      subgetoptpos = 0;
      subgetoptarg = (char *)0x0;
      return subgetoptdone;
    }
  }
  if (subgetoptpos == 0) {
    if (*argv[subgetoptind] != '-') {
      subgetoptarg = (char *)0x0;
      return subgetoptdone;
    }
    subgetoptpos = 1;
    cVar7 = argv[subgetoptind][1];
    if (cVar7 != '\0') {
      if (cVar7 != '-') goto LAB_00105c71;
      subgetoptind = subgetoptind + 1;
    }
    subgetoptpos = 0;
    iVar4 = subgetoptdone;
  }
  else {
LAB_00105c71:
    pcVar2 = argv[subgetoptind];
    lVar5 = (long)subgetoptpos;
    iVar3 = (int)pcVar2[lVar5];
    lVar6 = lVar5 + 1;
    subgetoptpos = (int)lVar6;
    cVar7 = *opts;
    while (iVar4 = subgetoptind, cVar7 != '\0') {
      cVar1 = opts[1];
      if (pcVar2[lVar5] == cVar7) {
        if (cVar1 != ':') {
          subgetoptarg = (char *)0x0;
          return iVar3;
        }
        iVar4 = subgetoptind + 1;
        subgetoptpos = 0;
        if (pcVar2[lVar6] != '\0') {
          subgetoptind = iVar4;
          subgetoptpos = 0;
          subgetoptarg = pcVar2 + lVar6;
          return iVar3;
        }
        subgetoptarg = argv[(long)subgetoptind + 1];
        if (iVar4 < argc && subgetoptarg != (char *)0x0) {
          subgetoptind = subgetoptind + 2;
          subgetoptpos = 0;
          return iVar3;
        }
        break;
      }
      if (cVar1 == ':') {
        pcVar8 = opts + 2;
      }
      else {
        pcVar8 = opts + 1;
      }
      cVar7 = opts[(ulong)(cVar1 == ':') + 1];
      opts = pcVar8;
    }
    subgetoptind = iVar4;
    iVar4 = 0x3f;
    subgetoptproblem = iVar3;
  }
  return iVar4;
}

Assistant:

int sgopt(int argc,const char *const *argv,const char *opts)
{
  int c;
  const char *s;

  optarg = 0;
  if (!argv || (optind >= argc) || !argv[optind]) return optdone;
  if (optpos && !argv[optind][optpos]) {
    ++optind;
    optpos = 0;
    if ((optind >= argc) || !argv[optind]) return optdone;
  }
  if (!optpos) {
    if (argv[optind][0] != '-') return optdone;
    ++optpos;
    c = argv[optind][1];
    if ((c == '-') || (c == 0)) {
      if (c) ++optind;
      optpos = 0;
      return optdone;
    }
    /* otherwise c is reassigned below */
  }
  c = argv[optind][optpos];
  ++optpos;
  s = opts;
  while (*s) {
    if (c == *s) {
      if (s[1] == ':') {
        optarg = argv[optind] + optpos;
        ++optind;
        optpos = 0;
        if (!*optarg) {
          optarg = argv[optind];
          if ((optind >= argc) || !optarg) { /* argument past end */
            optproblem = c;
            return '?';
          }
          ++optind;
        }
      }
      return c;
    }
    ++s;
    if (*s == ':') ++s;
  }
  optproblem = c;
  return '?';
}